

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1112::run(TestCase1112 *this)

{
  word **this_00;
  bool bVar1;
  char *pcVar2;
  size_t __n;
  ArrayPtr<const_capnp::word> *pAVar3;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  __off_t extraout_RDX_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ReaderFor<capnp::Text> RVar5;
  char local_3c4;
  bool local_3c3;
  char local_3c2;
  DebugExpression<char> local_3c1;
  undefined1 local_3c0 [5];
  bool _kj_shouldLog_8;
  DebugComparison<char,_char_&> _kjCondition_8;
  undefined1 local_390 [5];
  bool _kj_shouldLog_7;
  DebugComparison<char,_char_&> _kjCondition_7;
  undefined1 local_360 [5];
  bool _kj_shouldLog_6;
  DebugComparison<char,_char_&> _kjCondition_6;
  undefined1 local_330 [5];
  bool _kj_shouldLog_5;
  DebugComparison<char,_char_&> _kjCondition_5;
  undefined1 local_300 [5];
  bool _kj_shouldLog_4;
  DebugComparison<char,_char_&> _kjCondition_4;
  char *local_2d0;
  bool local_2c1;
  char *pcStack_2c0;
  bool _kj_shouldLog_3;
  char *local_2b8;
  char *local_2b0;
  undefined1 local_2a8 [8];
  DebugComparison<char_*,_const_char_*> _kjCondition_3;
  int local_278;
  bool local_271;
  size_t sStack_270;
  bool _kj_shouldLog_2;
  int local_268;
  DebugExpression<int> local_264;
  undefined1 local_260 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_2;
  ReaderFor<capnp::Text> reader;
  size_t local_218;
  int local_210;
  bool local_209;
  undefined1 auStack_208 [7];
  bool _kj_shouldLog_1;
  size_t local_200;
  size_t local_1f8;
  int local_1f0;
  DebugExpression<int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_1;
  size_t local_1b0;
  int local_1a8;
  bool local_1a1;
  undefined1 auStack_1a0 [7];
  bool _kj_shouldLog;
  size_t local_198;
  size_t local_190;
  int local_188;
  DebugExpression<int> local_184;
  undefined1 local_180 [8];
  DebugComparison<int,_unsigned_long> _kjCondition;
  BuilderFor<capnp::Text> builder;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder message;
  TestCase1112 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::Text>((Orphan<capnp::Text> *)local_120,&local_130,0x11);
  Orphan<capnp::Text>::get
            ((BuilderFor<capnp::Text> *)&_kjCondition.result,(Orphan<capnp::Text> *)local_120);
  pcVar2 = Text::Builder::begin((Builder *)&_kjCondition.result);
  __n = Text::Builder::size((Builder *)&_kjCondition.result);
  memset(pcVar2,0x61,__n);
  local_188 = 4;
  local_184 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
  _auStack_1a0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1a0,0);
  local_190 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_180,&local_184,&local_190);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  __length = extraout_RDX;
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    __length = extraout_RDX_00;
    while (local_1a1 != false) {
      local_1a8 = 4;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      _kjCondition_1._32_8_ = AVar4.ptr;
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_1.result
                          ,0);
      local_1b0 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x45e,ERROR,
                 "\"failed: expected \" \"(4) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 4, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (4) == (message.getSegmentsForOutput()[0].size())",
                 (DebugComparison<int,_unsigned_long> *)local_180,&local_1a8,&local_1b0);
      __length = extraout_RDX_01;
      local_1a1 = false;
    }
  }
  Orphan<capnp::Text>::truncate((Orphan<capnp::Text> *)local_120,(char *)0x2,__length);
  local_1f0 = 2;
  local_1ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f0);
  _auStack_208 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_208,0);
  local_1f8 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_1e8,&local_1ec,&local_1f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_209 = kj::_::Debug::shouldLog(ERROR);
    while (local_209 != false) {
      local_210 = 2;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      reader.super_StringPtr.content.size_ = (size_t)AVar4.ptr;
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
                          &reader.super_StringPtr.content.size_,0);
      local_218 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x460,ERROR,
                 "\"failed: expected \" \"(2) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 2, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (2) == (message.getSegmentsForOutput()[0].size())",
                 (DebugComparison<int,_unsigned_long> *)local_1e8,&local_210,&local_218);
      local_209 = false;
    }
  }
  RVar5 = Orphan<capnp::Text>::getReader((Orphan<capnp::Text> *)local_120);
  reader.super_StringPtr.content.ptr = RVar5.super_StringPtr.content.size_;
  _kjCondition_2._32_8_ = RVar5.super_StringPtr.content.ptr;
  local_268 = 2;
  local_264 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_268);
  sStack_270 = kj::StringPtr::size((StringPtr *)&_kjCondition_2.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_260,&local_264,&stack0xfffffffffffffd90);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
  if (!bVar1) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      local_278 = 2;
      _kjCondition_3._32_8_ = kj::StringPtr::size((StringPtr *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x463,ERROR,
                 "\"failed: expected \" \"(2) == (reader.size())\", _kjCondition, 2, reader.size()",
                 (char (*) [40])"failed: expected (2) == (reader.size())",
                 (DebugComparison<int,_unsigned_long> *)local_260,&local_278,
                 (unsigned_long *)&_kjCondition_3.result);
      local_271 = false;
    }
  }
  local_2b8 = Text::Builder::begin((Builder *)&_kjCondition.result);
  local_2b0 = (char *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2b8);
  pcStack_2c0 = kj::StringPtr::begin((StringPtr *)&_kjCondition_2.result);
  kj::_::DebugExpression<char*>::operator==
            ((DebugComparison<char_*,_const_char_*> *)local_2a8,(DebugExpression<char*> *)&local_2b0
             ,&stack0xfffffffffffffd40);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a8);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      local_2d0 = Text::Builder::begin((Builder *)&_kjCondition.result);
      _kjCondition_4._32_8_ = kj::StringPtr::begin((StringPtr *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char*,char_const*>&,char*,char_const*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x464,ERROR,
                 "\"failed: expected \" \"(builder.begin()) == (reader.begin())\", _kjCondition, builder.begin(), reader.begin()"
                 ,(char (*) [55])"failed: expected (builder.begin()) == (reader.begin())",
                 (DebugComparison<char_*,_const_char_*> *)local_2a8,&local_2d0,
                 (char **)&_kjCondition_4.result);
      local_2c1 = false;
    }
  }
  _kjCondition_5._38_1_ = 0x61;
  _kjCondition_5._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_5.field_0x26);
  pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,0);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_char_&> *)local_300,
             (DebugExpression<char> *)&_kjCondition_5.field_0x27,pcVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_300);
  if (!bVar1) {
    _kjCondition_5._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._37_1_ != '\0') {
      _kjCondition_5._36_1_ = 0x61;
      pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,0);
      kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x466,ERROR,
                 "\"failed: expected \" \"(\'a\') == (builder[0])\", _kjCondition, \'a\', builder[0]"
                 ,(char (*) [39])"failed: expected (\'a\') == (builder[0])",
                 (DebugComparison<char,_char_&> *)local_300,&_kjCondition_5.field_0x24,pcVar2);
      _kjCondition_5._37_1_ = 0;
    }
  }
  _kjCondition_6._38_1_ = 0x61;
  _kjCondition_6._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_6.field_0x26);
  pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,1);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_char_&> *)local_330,
             (DebugExpression<char> *)&_kjCondition_6.field_0x27,pcVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
  if (!bVar1) {
    _kjCondition_6._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._37_1_ != '\0') {
      _kjCondition_6._36_1_ = 0x61;
      pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,1);
      kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x467,ERROR,
                 "\"failed: expected \" \"(\'a\') == (builder[1])\", _kjCondition, \'a\', builder[1]"
                 ,(char (*) [39])"failed: expected (\'a\') == (builder[1])",
                 (DebugComparison<char,_char_&> *)local_330,&_kjCondition_6.field_0x24,pcVar2);
      _kjCondition_6._37_1_ = 0;
    }
  }
  _kjCondition_7._38_1_ = 0;
  _kjCondition_7._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_7.field_0x26);
  pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,2);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_char_&> *)local_360,
             (DebugExpression<char> *)&_kjCondition_7.field_0x27,pcVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_360);
  if (!bVar1) {
    _kjCondition_7._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._37_1_ != '\0') {
      _kjCondition_7._36_1_ = 0;
      pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,2);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x468,ERROR,
                 "\"failed: expected \" \"(\'\\\\0\') == (builder[2])\", _kjCondition, \'\\0\', builder[2]"
                 ,(char (*) [40])"failed: expected (\'\\0\') == (builder[2])",
                 (DebugComparison<char,_char_&> *)local_360,&_kjCondition_7.field_0x24,pcVar2);
      _kjCondition_7._37_1_ = 0;
    }
  }
  _kjCondition_8._38_1_ = 0;
  _kjCondition_8._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_8.field_0x26);
  pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,3);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_char_&> *)local_390,
             (DebugExpression<char> *)&_kjCondition_8.field_0x27,pcVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_390);
  if (!bVar1) {
    _kjCondition_8._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._37_1_ != '\0') {
      _kjCondition_8._36_1_ = 0;
      pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,3);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x469,ERROR,
                 "\"failed: expected \" \"(\'\\\\0\') == (builder[3])\", _kjCondition, \'\\0\', builder[3]"
                 ,(char (*) [40])"failed: expected (\'\\0\') == (builder[3])",
                 (DebugComparison<char,_char_&> *)local_390,&_kjCondition_8.field_0x24,pcVar2);
      _kjCondition_8._37_1_ = 0;
    }
  }
  local_3c2 = '\0';
  local_3c1 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3c2);
  pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,0x10);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_char_&> *)local_3c0,&local_3c1,pcVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
  if (!bVar1) {
    local_3c3 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c3 != false) {
      local_3c4 = '\0';
      pcVar2 = Text::Builder::operator[]((Builder *)&_kjCondition.result,0x10);
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x46a,ERROR,
                 "\"failed: expected \" \"(\'\\\\0\') == (builder[16])\", _kjCondition, \'\\0\', builder[16]"
                 ,(char (*) [41])"failed: expected (\'\\0\') == (builder[16])",
                 (DebugComparison<char,_char_&> *)local_3c0,&local_3c4,pcVar2);
      local_3c3 = false;
    }
  }
  Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, TruncateText) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Text>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 'a', builder.size());

  EXPECT_EQ(4, message.getSegmentsForOutput()[0].size());
  orphan.truncate(2);
  EXPECT_EQ(2, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(2, reader.size());
  EXPECT_EQ(builder.begin(), reader.begin());

  EXPECT_EQ('a', builder[0]);
  EXPECT_EQ('a', builder[1]);
  EXPECT_EQ('\0', builder[2]);
  EXPECT_EQ('\0', builder[3]);
  EXPECT_EQ('\0', builder[16]);
}